

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::handleRotations(QPDFJob *this,QPDF *pdf)

{
  int iVar1;
  element_type *peVar2;
  pointer piVar3;
  int max;
  unsigned_long __n;
  reference this_00;
  _Base_ptr p_Var4;
  pointer piVar5;
  int pageno;
  _Rb_tree_node_base *local_88;
  _Vector_base<int,_std::allocator<int>_> local_80;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&dh,pdf);
  QPDFPageDocumentHelper::getAllPages(&pages,&dh);
  local_80._M_impl.super__Vector_impl_data._M_start =
       (pointer)(((long)pages.
                        super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pages.
                       super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  max = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&local_80);
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88 = &(peVar2->rotations)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var4 = *(_Base_ptr *)((long)&(peVar2->rotations)._M_t._M_impl.super__Rb_tree_header + 0x10)
      ; p_Var4 != local_88; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&local_80,*(char **)(p_Var4 + 1),max)
    ;
    piVar3 = local_80._M_impl.super__Vector_impl_data._M_finish;
    for (piVar5 = local_80._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar3;
        piVar5 = piVar5 + 1) {
      iVar1 = *piVar5;
      pageno = iVar1 + -1;
      if (iVar1 <= max && 0 < iVar1) {
        __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&pageno);
        this_00 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                            (&pages,__n);
        QPDFPageObjectHelper::rotatePage(this_00,p_Var4[2]._M_color,(bool)p_Var4[2].field_0x4);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_80);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
  return;
}

Assistant:

void
QPDFJob::handleRotations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    int npages = QIntC::to_int(pages.size());
    for (auto const& iter: m->rotations) {
        std::string const& range = iter.first;
        QPDFJob::RotationSpec const& rspec = iter.second;
        // range has been previously validated
        for (int pageno_iter: QUtil::parse_numrange(range.c_str(), npages)) {
            int pageno = pageno_iter - 1;
            if ((pageno >= 0) && (pageno < npages)) {
                pages.at(QIntC::to_size(pageno)).rotatePage(rspec.angle, rspec.relative);
            }
        }
    }
}